

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::WriteElemTableInit
          (CWriter *this,bool active_initialization,ElemSegment *src_segment,Table *dst_table)

{
  Enum EVar1;
  pointer piVar2;
  pointer piVar3;
  char *pcVar4;
  size_t size;
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *extraout_RDX_01;
  Newline *u;
  size_t sStack_70;
  GlobalName local_58;
  StackVar local_48;
  StackVar local_3c;
  
  EVar1 = (dst_table->elem_type).enum_;
  if (1 < (uint)(EVar1 + 0x11)) {
    __assert_fail("dst_table->elem_type == Type::FuncRef || dst_table->elem_type == Type::ExternRef"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                  ,0x773,
                  "void wabt::(anonymous namespace)::CWriter::WriteElemTableInit(bool, const ElemSegment *, const Table *)"
                 );
  }
  if (EVar1 != (src_segment->elem_type).enum_) {
    __assert_fail("dst_table->elem_type == src_segment->elem_type",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                  ,0x774,
                  "void wabt::(anonymous namespace)::CWriter::WriteElemTableInit(bool, const ElemSegment *, const Table *)"
                 );
  }
  pcVar4 = GetReferenceTypeName(&dst_table->elem_type);
  local_58.type = Table;
  local_58.name = &dst_table->name;
  size = strlen(pcVar4);
  WriteData(this,pcVar4,size);
  WriteData(this,"_table_init(",0xc);
  Write(this,(ExternalInstancePtr *)&local_58);
  WriteData(this,", ",2);
  if ((dst_table->elem_type).enum_ == FuncRef) {
    if ((src_segment->elem_exprs).
        super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (src_segment->elem_exprs).
        super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pcVar4 = "NULL, ";
      sStack_70 = 6;
    }
    else {
      local_58.name = &src_segment->name;
      local_58.type = ElemSegment;
      WriteData(this,"elem_segment_exprs_",0x13);
      Write(this,&local_58);
      pcVar4 = ", ";
      sStack_70 = 2;
    }
    WriteData(this,pcVar4,sStack_70);
  }
  if (active_initialization) {
    Write(this,(Index)(((long)(src_segment->elem_exprs).
                              super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(src_segment->elem_exprs).
                             super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18));
    WriteData(this,", ",2);
    WriteInitExpr(this,&src_segment->offset);
    piVar2 = (src_segment->elem_exprs).
             super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    piVar3 = (src_segment->elem_exprs).
             super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    WriteData(this,", 0, ",5);
    Write(this,(Index)(((long)piVar2 - (long)piVar3) / 0x18));
    u = extraout_RDX;
    goto LAB_00194ce7;
  }
  if (src_segment->kind == Passive) {
    piVar2 = (src_segment->elem_exprs).
             super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (src_segment->elem_exprs).
             super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (piVar2 == piVar3) goto LAB_00194c5a;
    local_58.name = &src_segment->name;
    local_58.type = ElemSegment;
    WriteData(this,"(instance->elem_segment_dropped_",0x20);
    Write(this,&local_58);
    WriteData(this," ? 0 : ",7);
    Write(this,(Index)(((long)piVar3 - (long)piVar2) / 0x18));
    pcVar4 = "), ";
  }
  else {
LAB_00194c5a:
    pcVar4 = "0, ";
  }
  WriteData(this,pcVar4,3);
  local_58.type = Import;
  local_58._4_4_ = 0;
  local_58.name._0_4_ = 0xffffffff;
  local_3c.index = 1;
  local_3c.type.enum_ = Any;
  local_3c.type.type_index_ = 0xffffffff;
  local_48.index = 0;
  local_48.type.enum_ = Any;
  local_48.type.type_index_ = 0xffffffff;
  Write(this,(StackVar *)&local_58);
  WriteData(this,", ",2);
  Write(this,&local_3c);
  WriteData(this,", ",2);
  Write(this,&local_48);
  u = extraout_RDX_00;
LAB_00194ce7:
  if ((dst_table->elem_type).enum_ == FuncRef) {
    WriteData(this,", instance",10);
    u = extraout_RDX_01;
  }
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [3])0x1df5c4,u);
  return;
}

Assistant:

void CWriter::WriteElemTableInit(bool active_initialization,
                                 const ElemSegment* src_segment,
                                 const Table* dst_table) {
  assert(dst_table->elem_type == Type::FuncRef ||
         dst_table->elem_type == Type::ExternRef);
  assert(dst_table->elem_type == src_segment->elem_type);

  Write(GetReferenceTypeName(dst_table->elem_type), "_table_init(",
        ExternalInstancePtr(ModuleFieldType::Table, dst_table->name), ", ");

  // elem segment exprs needed only for funcref tables
  // because externref tables can only be initialized with ref.null
  if (dst_table->elem_type == Type::FuncRef) {
    if (src_segment->elem_exprs.empty()) {
      Write("NULL, ");
    } else {
      Write("elem_segment_exprs_",
            GlobalName(ModuleFieldType::ElemSegment, src_segment->name), ", ");
    }
  }

  // src_size, dest_addr, src_addr, N
  if (active_initialization) {
    Write(src_segment->elem_exprs.size(), ", ");
    WriteInitExpr(src_segment->offset);
    Write(", 0, ", src_segment->elem_exprs.size());
  } else {
    if (is_droppable(src_segment)) {
      Write("(instance->elem_segment_dropped_",
            GlobalName(ModuleFieldType::ElemSegment, src_segment->name),
            " ? 0 : ", src_segment->elem_exprs.size(), "), ");
    } else {
      Write("0, ");
    }
    Write(StackVar(2), ", ", StackVar(1), ", ", StackVar(0));
  }

  if (dst_table->elem_type == Type::FuncRef) {
    Write(", instance");
  }

  Write(");", Newline());
}